

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::ProcessScopeWithCapturedSym(ByteCodeGenerator *this,Scope *scope)

{
  FuncInfo *this_00;
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 *puVar4;
  
  if ((scope->field_0x45 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0xc85,"(scope->GetHasOwnLocalInClosure())",
                       "scope->GetHasOwnLocalInClosure()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = scope->func;
  if (((this_00->bodyScope == scope) || (this_00->paramScope == scope)) ||
     (uVar3 = *(ushort *)&scope->field_0x44,
     (uVar3 & 0x16) == 4 && (scope->scopeType & ~ScopeType_Global) != ScopeType_Catch)) {
    this_00->field_0xb4 = this_00->field_0xb4 | 0x40;
  }
  else {
    if ((uVar3 & 0x20) != 0) {
      FuncInfo::SetHasMaybeEscapedNestedFunc(this_00,L"InstantiateScopeWithCrossScopeAssignment");
      uVar3 = *(ushort *)&scope->field_0x44;
    }
    *(ushort *)&scope->field_0x44 = uVar3 | 0x10;
  }
  return;
}

Assistant:

void ByteCodeGenerator::ProcessScopeWithCapturedSym(Scope *scope)
{
    Assert(scope->GetHasOwnLocalInClosure());

    // (Note: if any catch var is closure-captured, we won't merge the catch scope with the function scope.
    // So don't mark the function scope "has local in closure".)
    FuncInfo *func = scope->GetFunc();
    bool notCatch = scope->GetScopeType() != ScopeType_Catch && scope->GetScopeType() != ScopeType_CatchParamPattern;
    if (scope == func->GetBodyScope() || scope == func->GetParamScope() || (scope->GetCanMerge() && notCatch))
    {
        func->SetHasLocalInClosure(true);
    }
    else
    {
        if (scope->HasCrossScopeFuncAssignment())
        {
            func->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("InstantiateScopeWithCrossScopeAssignment")));
        }
        scope->SetMustInstantiate(true);
    }
}